

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O2

int __thiscall NodeBTree::equalKeyCompareOp(NodeBTree *this,KeyType *key,uint8_t *data)

{
  uint uVar1;
  uint64_t uVar2;
  uint8_t *local_10;
  
  local_10 = data + 1;
  uVar2 = decodeBitsAndAdvance(&local_10);
  uVar1 = 0xffffffff;
  if ((uint)uVar2 <= key->m_nodeIndex) {
    uVar1 = (uint)((uint)uVar2 < key->m_nodeIndex);
  }
  return uVar1;
}

Assistant:

int equalKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		const auto flags = readNext<uint8_t>(data);
		UNUSED(flags);

		const auto nodeIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		if (key.nodeIndex() < nodeIndex)
			return -1;
		else if (key.nodeIndex() > nodeIndex)
			return 1;

		return 0;
	}